

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionIntroduction.cpp
# Opt level: O2

Term * __thiscall
Inferences::DefinitionIntroduction::lgg(DefinitionIntroduction *this,Term *left,Term *right)

{
  TermList TVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  TermList TVar5;
  Term *pTVar6;
  long lVar7;
  uint val;
  pair<Kernel::TermList,_Kernel::TermList> key;
  IncompleteFunction elem;
  uint mapped;
  SubtermIterator right_it;
  SubtermIterator left_it;
  uint local_9c;
  Term *local_98;
  pair<Kernel::TermList,_Kernel::TermList> local_90;
  SubtermIterator local_80;
  SubtermIterator local_58;
  
  local_98 = left;
  Kernel::SubtermIterator::SubtermIterator(&local_58,left);
  Kernel::SubtermIterator::SubtermIterator(&local_80,right);
  val = 0;
  do {
    bVar3 = Kernel::SubtermIterator::hasNext(&local_58);
    if (!bVar3) {
      pTVar6 = Kernel::Term::create
                         (local_98->_functor,*(uint *)&local_98->field_0xc & 0xfffffff,
                          (TermList *)Inferences::args._8_8_);
      Inferences::args._16_8_ = Inferences::args._8_8_;
      Lib::
      DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::reset((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)substitution);
      Kernel::SubtermIterator::~SubtermIterator(&local_80);
      Kernel::SubtermIterator::~SubtermIterator(&local_58);
      return pTVar6;
    }
    Kernel::SubtermIterator::hasNext(&local_80);
    local_58._used = true;
    TVar5._content =
         (*(TermList ***)
           ((long)local_58._stack._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl
           + 0x10))[-1]->_content;
    local_80._used = true;
    TVar1._content =
         (*(TermList ***)
           ((long)local_80._stack._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl
           + 0x10))[-1]->_content;
    if (((((uint)TVar1._content | (uint)TVar5._content) & 3) == 0) &&
       (*(int *)(TVar5._content + 8) == *(int *)(TVar1._content + 8))) {
      elem.remaining = *(uint *)(TVar5._content + 0xc) & 0xfffffff;
      elem._0_8_ = CONCAT44(*(uint *)(TVar5._content + 0xc),*(int *)(TVar5._content + 8)) &
                   0xfffffffffffffff;
      Lib::Stack<Inferences::IncompleteFunction>::push
                ((Stack<Inferences::IncompleteFunction> *)functions,elem);
      lVar4 = functions._16_8_;
      lVar7 = functions._8_8_;
    }
    else {
      local_90.first._content = TVar5._content;
      local_90.second._content = TVar1._content;
      bVar3 = Lib::
              DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::find((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)substitution,&local_90,&local_9c);
      if (!bVar3) {
        key.second._content = TVar1._content;
        key.first._content = TVar5._content;
        local_9c = val;
        Lib::
        DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::insert((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)substitution,key,val);
        val = val + 1;
      }
      TVar5._content._4_4_ = 0;
      TVar5._content._0_4_ = local_9c * 4 + 1;
      Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)Inferences::args,TVar5);
      Kernel::SubtermIterator::right(&local_58);
      Kernel::SubtermIterator::right(&local_80);
      lVar4 = functions._16_8_;
      lVar7 = functions._8_8_;
      if (functions._16_8_ != functions._8_8_) goto LAB_003e4223;
    }
    while ((lVar4 != lVar7 && (*(int *)(lVar4 + -4) == 0))) {
      functions._16_8_ = lVar4 + -0xc;
      uVar2 = *(ulong *)(lVar4 + -0xc);
      TVar5._content =
           (uint64_t)
           Kernel::Term::create
                     ((uint)uVar2,(uint)(uVar2 >> 0x20),
                      (TermList *)(Inferences::args._16_8_ + (uVar2 >> 0x20) * -8));
      Inferences::args._16_8_ =
           Inferences::args._8_8_ +
           (((ulong)(Inferences::args._16_8_ - Inferences::args._8_8_) >> 3) - (uVar2 >> 0x20)) * 8;
      Lib::Stack<Kernel::TermList>::push((Stack<Kernel::TermList> *)Inferences::args,TVar5);
      if (functions._16_8_ == functions._8_8_) break;
LAB_003e4223:
      lVar4 = functions._16_8_;
      lVar7 = functions._8_8_;
      *(int *)(functions._16_8_ + -4) = *(int *)(functions._16_8_ + -4) + -1;
    }
  } while( true );
}

Assistant:

Term *DefinitionIntroduction::lgg(Term *left, Term *right) {
  ASS_EQ(left->functor(), right->functor())
  ASS_EQ(functions.length(), 0)
  ASS_EQ(args.length(), 0)

  unsigned fresh = 0;
  SubtermIterator left_it(left);
  SubtermIterator right_it(right);

  while(left_it.hasNext()) {
    ALWAYS(right_it.hasNext());
    TermList left_top = left_it.next();
    TermList right_top = right_it.next();

    if(left_top.isTerm() && right_top.isTerm() && left_top.term()->functor() == right_top.term()->functor()) {
      unsigned functor = left_top.term()->functor();
      unsigned arity = left_top.term()->arity();
      unsigned remaining = arity;
      functions.push({functor, arity, remaining});
    }
    else {
      unsigned mapped;
      if(!substitution.find({left_top, right_top}, mapped))
        substitution.insert({left_top, right_top}, mapped = fresh++);

      args.push(TermList(mapped, false));
      left_it.right();
      right_it.right();

      if(functions.isNonEmpty())
        functions.top().remaining--;
    }

    while(functions.isNonEmpty() && !functions.top().remaining) {
      IncompleteFunction record = functions.pop();
      Term *term = Term::create(record.functor, record.arity, args.end() - record.arity);
      args.truncate(args.length() - record.arity);
      args.push(TermList(term));

      if(functions.isNonEmpty())
        functions.top().remaining--;
      else
        break;
    }
  }

  ASS(functions.isEmpty());
  ASS_EQ(args.length(), left->arity());
  Term *term = Term::create(left->functor(), left->arity(), args.begin());

  args.reset();
  substitution.reset();
  return term;
}